

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void __thiscall dgMeshEffect::BoxMapping(dgMeshEffect *this,HaI32 front,HaI32 side,HaI32 top)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  dgTreeNode *this_00;
  dgBigVector *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  int iVar11;
  double *pdVar12;
  dgVertexAtribute *pdVar13;
  HaI32 i_00;
  int iVar14;
  ulong uVar15;
  dgRedBackNode *pdVar16;
  HaI32 i;
  int iVar17;
  int iVar18;
  dgRedBackNode *pdVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  dgStack<dgMeshEffect::dgVertexAtribute> attribArray;
  HaI32 materialArray [3];
  Iterator iter;
  dgBigVector minVal;
  dgBigVector maxVal;
  dgStack<dgMeshEffect::dgVertexAtribute> local_100;
  double local_f0;
  HaI32 local_e4 [3];
  Iterator local_d8;
  ulong local_c8;
  double local_c0;
  double local_b8;
  dgTemplateVector<double> local_b0;
  dgTemplateVector<double> local_90;
  dgBigVector local_70;
  dgBigVector local_50;
  
  GetMinMax(&local_70,&local_50,(HaF64 *)this->m_points,
            *(HaI32 *)&(this->super_dgRefCounter).field_0xc,0x20);
  if (((((long)ABS(local_50.super_dgTemplateVector<double>.m_x -
                   local_70.super_dgTemplateVector<double>.m_x) < 0x7ff0000000000000) &&
       ((long)ABS(local_50.super_dgTemplateVector<double>.m_y -
                  local_70.super_dgTemplateVector<double>.m_y) < 0x7ff0000000000000)) &&
      ((long)ABS(local_50.super_dgTemplateVector<double>.m_z -
                 local_70.super_dgTemplateVector<double>.m_z) < 0x7ff0000000000000)) &&
     ((ulong)ABS(local_50.super_dgTemplateVector<double>.m_w) < 0x7ff0000000000000)) {
    local_b8 = 1.0 / (local_50.super_dgTemplateVector<double>.m_x -
                     local_70.super_dgTemplateVector<double>.m_x);
    local_f0 = 1.0 / (local_50.super_dgTemplateVector<double>.m_y -
                     local_70.super_dgTemplateVector<double>.m_y);
    local_c0 = 1.0 / (local_50.super_dgTemplateVector<double>.m_z -
                     local_70.super_dgTemplateVector<double>.m_z);
    if (((NAN(local_c0)) || (0x7fefffffffffffff < (long)ABS(local_c0))) ||
       ((NAN(local_f0) ||
        ((0x7fefffffffffffff < (long)ABS(local_b8) || (0x7fefffffffffffff < (long)ABS(local_f0))))))
       ) {
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x159,
                    "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
    }
    iVar11 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count;
    local_100.super_dgStackBase.m_ptr = malloc((long)(iVar11 * 0x60));
    local_100.m_size = iVar11;
    if (-1 < iVar11) {
      EnumerateAttributeArray(this,(dgVertexAtribute *)local_100.super_dgStackBase.m_ptr);
      uVar5 = (this->super_dgPolyhedra).m_edgeMark;
      uVar15 = (ulong)uVar5;
      iVar11 = uVar5 + 1;
      (this->super_dgPolyhedra).m_edgeMark = iVar11;
      local_e4[0] = front;
      local_e4[1] = side;
      local_e4[2] = top;
      if (iVar11 == 0x7fffffff) {
        __assert_fail("m_edgeMark < 0x7fffffff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                      ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
      }
      local_d8.m_ptr = (dgRedBackNode *)0x0;
      this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
      local_d8.m_tree = (dgTree<dgEdge,_long> *)this;
      local_c8 = uVar15;
      if (this_00 == (dgTreeNode *)0x0) {
        local_d8.m_ptr = (dgRedBackNode *)0x0;
      }
      else {
        local_d8.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
      }
      while (local_d8.m_ptr != (dgRedBackNode *)0x0) {
        if (*(int *)&local_d8.m_ptr[2]._vptr_dgRedBackNode <= (int)uVar15) {
          pdVar6 = this->m_points;
          iVar14 = *(int *)&local_d8.m_ptr[1]._vptr_dgRedBackNode;
          pdVar19 = local_d8.m_ptr[1].m_right;
          pdVar16 = local_d8.m_ptr[1].m_parent;
          iVar17 = *(int *)&pdVar19->_vptr_dgRedBackNode;
          iVar18 = *(int *)&pdVar16->_vptr_dgRedBackNode;
          *(int *)&local_d8.m_ptr[2]._vptr_dgRedBackNode = iVar11;
          *(int *)&pdVar19[1]._vptr_dgRedBackNode = iVar11;
          *(int *)&pdVar16[1]._vptr_dgRedBackNode = iVar11;
          dVar1 = pdVar6[iVar14].super_dgTemplateVector<double>.m_x;
          dVar2 = pdVar6[iVar14].super_dgTemplateVector<double>.m_y;
          dVar7 = pdVar6[iVar17].super_dgTemplateVector<double>.m_x - dVar1;
          dVar8 = pdVar6[iVar17].super_dgTemplateVector<double>.m_y - dVar2;
          dVar3 = pdVar6[iVar14].super_dgTemplateVector<double>.m_z;
          dVar9 = pdVar6[iVar17].super_dgTemplateVector<double>.m_z - dVar3;
          dVar4 = pdVar6[iVar17].super_dgTemplateVector<double>.m_w;
          if ((((0x7fefffffffffffff < (long)ABS(dVar7)) || (0x7fefffffffffffff < (long)ABS(dVar8)))
              || (0x7fefffffffffffff < (long)ABS(dVar9))) ||
             (0x7fefffffffffffff < (ulong)ABS(dVar4))) goto LAB_008883c4;
          dVar1 = pdVar6[iVar18].super_dgTemplateVector<double>.m_x - dVar1;
          dVar2 = pdVar6[iVar18].super_dgTemplateVector<double>.m_y - dVar2;
          dVar3 = pdVar6[iVar18].super_dgTemplateVector<double>.m_z - dVar3;
          if (((0x7fefffffffffffff < (long)ABS(dVar1)) || (0x7fefffffffffffff < (long)ABS(dVar2)))
             || ((0x7fefffffffffffff < (long)ABS(dVar3) ||
                 (0x7fefffffffffffff < (ulong)ABS(pdVar6[iVar18].super_dgTemplateVector<double>.m_w)
                 )))) goto LAB_008883c4;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar8;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar3;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar2 * dVar9;
          auVar20 = vfmsub231sd_fma(auVar31,auVar24,auVar29);
          local_b0.m_x = auVar20._0_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar9;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar1;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar3 * dVar7;
          auVar20 = vfmsub231sd_fma(auVar30,auVar28,auVar26);
          local_b0.m_y = auVar20._0_8_;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar7;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = dVar1 * dVar8;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar2;
          auVar20 = vfmsub231sd_fma(auVar25,auVar20,auVar27);
          local_b0.m_z = auVar20._0_8_;
          local_b0.m_w = dVar4;
          if (((0x7fefffffffffffff < (ulong)ABS(local_b0.m_x)) ||
              (0x7fefffffffffffff < (ulong)ABS(local_b0.m_y))) ||
             (0x7fefffffffffffff < (ulong)ABS(local_b0.m_z))) goto LAB_008883c4;
          pdVar19 = local_d8.m_ptr + 1;
          auVar23 = ZEXT1664((undefined1  [16])0x0);
          iVar17 = 0;
          iVar14 = 0;
          do {
            auVar22._0_8_ = auVar23._0_8_;
            pdVar12 = dgTemplateVector<double>::operator[](&local_b0,iVar17);
            auVar22._8_8_ = 0;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = *pdVar12;
            auVar10._8_8_ = 0x7fffffffffffffff;
            auVar10._0_8_ = 0x7fffffffffffffff;
            auVar20 = vandpd_avx512vl(auVar21,auVar10);
            if (auVar22._0_8_ < auVar20._0_8_) {
              iVar14 = iVar17;
            }
            auVar20 = vmaxsd_avx(auVar20,auVar22);
            auVar23 = ZEXT1664(auVar20);
            iVar17 = iVar17 + 1;
          } while (iVar17 != 3);
          iVar18 = (iVar14 + 2 + ((iVar14 + 1) / 3) * -3) % 3;
          i_00 = 2;
          iVar17 = iVar18;
          if (iVar14 != 1) {
            iVar17 = (iVar14 + 1) % 3;
            i_00 = iVar18;
          }
          pdVar16 = pdVar19;
          do {
            pdVar13 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[]
                                (&local_100,*(HaI32 *)&pdVar16->m_left);
            pdVar6 = this->m_points;
            iVar18 = *(int *)&pdVar16->_vptr_dgRedBackNode;
            local_90.m_w = pdVar6[iVar18].super_dgTemplateVector<double>.m_w;
            local_90.m_x = (pdVar6[iVar18].super_dgTemplateVector<double>.m_x -
                           local_70.super_dgTemplateVector<double>.m_x) * local_b8;
            local_90.m_y = (pdVar6[iVar18].super_dgTemplateVector<double>.m_y -
                           local_70.super_dgTemplateVector<double>.m_y) * local_f0;
            local_90.m_z = (pdVar6[iVar18].super_dgTemplateVector<double>.m_z -
                           local_70.super_dgTemplateVector<double>.m_z) * local_c0;
            if ((((0x7fefffffffffffff < (long)ABS(local_90.m_x)) ||
                 (0x7fefffffffffffff < (long)ABS(local_90.m_y))) ||
                (0x7fefffffffffffff < (long)ABS(local_90.m_z))) ||
               (0x7fefffffffffffff < (ulong)ABS(local_90.m_w))) goto LAB_008883c4;
            pdVar12 = dgTemplateVector<double>::operator[](&local_90,iVar17);
            pdVar13->m_u0 = (HaF64)*pdVar12;
            pdVar12 = dgTemplateVector<double>::operator[](&local_90,i_00);
            pdVar13->m_v0 = (HaF64)*pdVar12;
            pdVar13->m_u1 = 0.0;
            pdVar13->m_v1 = 0.0;
            pdVar13->m_material = (HaF64)(double)local_e4[iVar14];
            pdVar16 = pdVar16->m_right;
            uVar15 = local_c8;
          } while (pdVar16 != pdVar19);
        }
        dgTree<dgEdge,_long>::Iterator::operator++(&local_d8,0);
      }
      if (-1 < local_100.m_size) {
        ApplyAttributeArray(this,(dgVertexAtribute *)local_100.super_dgStackBase.m_ptr);
        free(local_100.super_dgStackBase.m_ptr);
        return;
      }
    }
    __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                  ,0x60,
                  "T &dgStack<dgMeshEffect::dgVertexAtribute>::operator[](hacd::HaI32) [T = dgMeshEffect::dgVertexAtribute]"
                 );
  }
LAB_008883c4:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

void dgMeshEffect::BoxMapping (hacd::HaI32 front, hacd::HaI32 side, hacd::HaI32 top)
{
	dgBigVector minVal;
	dgBigVector maxVal;
	hacd::HaI32 materialArray[3];

	GetMinMax (minVal, maxVal, &m_points[0][0], m_pointCount, sizeof (dgBigVector));
	dgBigVector dist (maxVal - minVal);
	dgBigVector scale (hacd::HaF64 (1.0f)/ dist[0], hacd::HaF64 (1.0f)/ dist[1], hacd::HaF64 (1.0f)/ dist[2], hacd::HaF64 (0.0f));

	dgStack<dgVertexAtribute>attribArray (GetCount());
	EnumerateAttributeArray (&attribArray[0]);

	materialArray[0] = front;
	materialArray[1] = side;
	materialArray[2] = top;

	hacd::HaI32 mark = IncLRU();
	dgPolyhedra::Iterator iter (*this);	
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		if (edge->m_mark < mark){
			const dgBigVector& p0 = m_points[edge->m_incidentVertex];
			const dgBigVector& p1 = m_points[edge->m_next->m_incidentVertex];
			const dgBigVector& p2 = m_points[edge->m_prev->m_incidentVertex];

			edge->m_mark = mark;
			edge->m_next->m_mark = mark;
			edge->m_prev->m_mark = mark;

			dgBigVector e0 (p1 - p0);
			dgBigVector e1 (p2 - p0);
			dgBigVector n (e0 * e1);
			
			hacd::HaI32 index = 0;
			hacd::HaF64 maxProjection = hacd::HaF32 (0.0f);

			for (hacd::HaI32 i = 0; i < 3; i ++) {
				hacd::HaF64 proj = fabs (n[i]);
				if (proj > maxProjection) {
					index = i;
					maxProjection = proj;
				}
			}

			hacd::HaI32 u = (index + 1) % 3;
			hacd::HaI32 v = (u + 1) % 3;
			if (index == 1) {
				Swap (u, v);
			}
			dgEdge* ptr = edge;
			do {
				dgVertexAtribute& attrib = attribArray[hacd::HaI32 (ptr->m_userData)];
				dgBigVector p (scale.CompProduct(m_points[ptr->m_incidentVertex] - minVal));
				attrib.m_u0 = p[u];
				attrib.m_v0 = p[v];
				attrib.m_u1 = hacd::HaF64(0.0f);
				attrib.m_v1 = hacd::HaF64(0.0f);
				attrib.m_material = materialArray[index];

				ptr = ptr->m_next;
			}while (ptr !=  edge);
		}
	}

	ApplyAttributeArray (&attribArray[0]);
}